

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_builder.cc
# Opt level: O0

string * __thiscall
iqxmlrpc::XmlBuilder::content_abi_cxx11_(string *__return_storage_ptr__,XmlBuilder *this)

{
  uint uVar1;
  char *pcVar2;
  allocator local_21;
  char *local_20;
  char *cdata;
  XmlBuilder *this_local;
  
  cdata = (char *)this;
  this_local = (XmlBuilder *)__return_storage_ptr__;
  xmlTextWriterFlush(this->writer);
  pcVar2 = (char *)xmlBufferContent(this->buf);
  uVar1 = this->buf->use;
  local_20 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(ulong)uVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return __return_storage_ptr__;
}

Assistant:

std::string
XmlBuilder::content() const
{
  xmlTextWriterFlush(writer);
  const char* cdata = reinterpret_cast<const char*>(xmlBufferContent(buf));
  return std::string(cdata, buf->use);
}